

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string * cs_impl::
         to_string<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
                   (hash_set *set)

{
  bool bVar1;
  undefined1 uVar2;
  any *this;
  undefined8 in_RSI;
  string *in_RDI;
  const_iterator cVar3;
  var *it;
  const_iterator __end1;
  const_iterator __begin1;
  hash_set *__range1;
  string str;
  const_iterator *in_stack_fffffffffffffee8;
  string *psVar4;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  string local_c0 [32];
  string local_a0 [32];
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *local_80;
  iterator local_78;
  any *local_68;
  anon_union_8_1_a8a14541_for_iterator_1 local_60;
  undefined8 local_58;
  allocator local_49;
  string local_48 [55];
  allocator local_11;
  undefined8 local_10;
  
  local_10 = in_RSI;
  bVar1 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ::empty((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                   *)0x265de1);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"cs::hash_set => {}",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"cs::hash_set => {",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_58 = local_10;
    cVar3 = phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
            ::begin(in_stack_fffffffffffffef0);
    local_60 = cVar3.inner_.field_1;
    this = (any *)cVar3.inner_.ctrl_;
    local_68 = this;
    local_78 = (iterator)
               phmap::priv::
               raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
               ::end(in_stack_fffffffffffffef0);
    while( true ) {
      uVar2 = phmap::priv::operator!=
                        ((const_iterator *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
      if (!(bool)uVar2) break;
      in_stack_fffffffffffffef0 =
           (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
            *)phmap::priv::
              raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
              ::const_iterator::operator*((const_iterator *)0x265f2e);
      local_80 = in_stack_fffffffffffffef0;
      any::to_string_abi_cxx11_(this);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar2,in_stack_fffffffffffffef8),(char *)in_stack_fffffffffffffef0);
      std::__cxx11::string::operator+=(local_48,local_a0);
      std::__cxx11::string::~string(local_a0);
      std::__cxx11::string::~string(local_c0);
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffef0);
    }
    psVar4 = local_48;
    std::__cxx11::string::size();
    std::__cxx11::string::resize((ulong)psVar4);
    std::__cxx11::string::operator+=(local_48,"}");
    std::__cxx11::string::string((string *)in_RDI,local_48);
    std::__cxx11::string::~string(local_48);
  }
  return in_RDI;
}

Assistant:

std::string to_string<cs::hash_set>(const cs::hash_set &set)
	{
		if (set.empty())
			return "cs::hash_set => {}";
		std::string str = "cs::hash_set => {";
		for (const cs::var &it: set)
			str += it.to_string() + ", ";
		str.resize(str.size() - 2);
		str += "}";
		return std::move(str);
	}